

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

_Bool prefix_i(char *s,char *t)

{
  __int32_t **pp_Var1;
  ulong uVar2;
  long lVar3;
  
  for (lVar3 = 0; uVar2 = (ulong)(byte)t[lVar3], uVar2 != 0; lVar3 = lVar3 + 1) {
    pp_Var1 = __ctype_toupper_loc();
    if ((*pp_Var1)[uVar2] != (*pp_Var1)[(byte)s[lVar3]]) break;
  }
  return uVar2 == 0;
}

Assistant:

bool prefix_i(const char *s, const char *t)
{
	/* Scan "t" */
	while (*t)
	{
		if (toupper((unsigned char)*t) != toupper((unsigned char)*s))
			return (false);
		else
		{
			t++;
			s++;
		}
	}

	/* Matched, we have a prefix */
	return (true);
}